

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  byte bVar1;
  ushort uVar2;
  MCode *pMVar3;
  uint ref;
  Reg RVar4;
  int iVar5;
  Reg rb;
  int in_EDX;
  IRIns *in_RSI;
  ASMState *in_RDI;
  x86Op xo;
  Reg left;
  IRRef tmp;
  MCode *p;
  int32_t k;
  Reg right;
  Reg dest;
  RegSet allow;
  IRRef rref;
  IRRef lref;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  x86Op xo_00;
  RegSet in_stack_ffffffffffffffc0;
  IRRef in_stack_ffffffffffffffc4;
  ASMState *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t i;
  uint local_28;
  
  uVar2 = (in_RSI->field_0).op1;
  ref = (uint)(in_RSI->field_0).op2;
  i = 0;
  if (in_RDI->flagmcp == in_RDI->mcp) {
    iVar5 = 2;
    if (*in_RDI->mcp < 0x84) {
      iVar5 = 3;
    }
    in_stack_ffffffffffffffc8 = (ASMState *)(in_RDI->mcp + iVar5);
    if ((*(byte *)((long)in_stack_ffffffffffffffc8->cost + 1) & 0xf) < 0xe) {
      if (0xb < (*(byte *)((long)in_stack_ffffffffffffffc8->cost + 1) & 0xf)) {
        *(MCode *)((long)in_stack_ffffffffffffffc8->cost + 1) =
             *(MCode *)((long)in_stack_ffffffffffffffc8->cost + 1) + 0xfc;
      }
      in_RDI->flagmcp = (MCode *)0x0;
      in_RDI->mcp = (MCode *)in_stack_ffffffffffffffc8;
    }
  }
  bVar1 = *(byte *)((long)in_RDI->ir + (ulong)ref * 8 + 6);
  if ((bVar1 & 0x80) == 0) {
    in_RDI->weakset = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
  }
  RVar4 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (IRIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  local_28 = RVar4;
  if (((uVar2 != ref) && (local_28 = (uint)bVar1, (bVar1 & 0x80) != 0)) &&
     (iVar5 = asm_isk32(in_RDI,ref,(int32_t *)&stack0xffffffffffffffd4), iVar5 == 0)) {
    iVar5 = asm_swapops(in_RDI,in_RSI);
    if (iVar5 != 0) {
      in_stack_ffffffffffffffc4 = (uint)uVar2;
    }
    local_28 = asm_fuseloadm(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  if (((in_RSI->field_1).t.irt & 0x80) != 0) {
    asm_guardcc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  }
  if (in_EDX == 8) {
    if ((local_28 & 0x80) != 0) {
      rb = asm_fuseloadm(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (i == (char)(MCode)i) {
        pMVar3 = in_RDI->mcp;
        in_RDI->mcp = pMVar3 + -1;
        pMVar3[-1] = (MCode)i;
        xo_00 = XO_IMULi8;
      }
      else {
        *(int32_t *)(in_RDI->mcp + -4) = i;
        in_RDI->mcp = in_RDI->mcp + -4;
        xo_00 = XO_IMULi;
      }
      iVar5 = 0;
      if ((0x604208U >> ((in_RSI->field_1).t.irt & 0x1f) & 1) != 0) {
        iVar5 = 0x80200;
      }
      emit_mrm(in_RDI,xo_00,RVar4 + iVar5,rb);
      return;
    }
    iVar5 = 0;
    if ((0x604208U >> ((in_RSI->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar5 = 0x80200;
    }
    emit_mrm(in_RDI,XO_IMUL,RVar4 + iVar5,local_28);
  }
  else if ((local_28 & 0x80) == 0) {
    iVar5 = 0;
    if ((0x604208U >> ((in_RSI->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar5 = 0x80200;
    }
    emit_mrm(in_RDI,in_EDX * 0x8000000 + 0x30000fe,RVar4 + iVar5,local_28);
  }
  else {
    iVar5 = 0;
    if ((0x604208U >> ((in_RSI->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar5 = 0x80200;
    }
    emit_gri(in_RDI,in_EDX + 0x838100,RVar4 + iVar5,i);
  }
  ra_left((ASMState *)CONCAT44(i,in_stack_ffffffffffffffd0),
          (Reg)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(IRRef)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    if ((p[1] & 15) < 14) {
      if ((p[1] & 15) >= 12) p[1] -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}